

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

void mfascii(mFILE *mf)

{
  size_t local_20;
  size_t p2;
  size_t p1;
  mFILE *mf_local;
  
  local_20 = 1;
  for (p2 = 1; p2 < mf->size; p2 = p2 + 1) {
    if ((mf->data[p2] == '\n') && (mf->data[p2 - 1] == '\r')) {
      local_20 = local_20 - 1;
    }
    mf->data[local_20] = mf->data[p2];
    local_20 = local_20 + 1;
  }
  mf->size = local_20;
  mf->flush_pos = 0;
  mf->offset = 0;
  return;
}

Assistant:

void mfascii(mFILE *mf) {
    size_t p1, p2;

    for (p1 = p2 = 1; p1 < mf->size; p1++, p2++) {
	if (mf->data[p1] == '\n' && mf->data[p1-1] == '\r') {
	    p2--; /* delete the \r */
	}
	mf->data[p2] = mf->data[p1];
    }
    mf->size = p2;

    mf->offset = mf->flush_pos = 0;
}